

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetProperty_Internal<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info,bool isInit)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  byte bVar7;
  DynamicObject *instance_00;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  Var local_48;
  DynamicObject *local_40;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)info;
  local_40 = instance;
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId,scriptContext);
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_48 = value;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x34d,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) goto LAB_00c322e9;
    *puVar6 = 0;
    value = local_48;
  }
  local_58 = ScriptContext::GetPropertyName(scriptContext,propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_58,&local_38);
  if (!bVar2) {
    if (local_58->isNumeric == true) {
      uVar3 = PropertyRecord::GetNumericValue(local_58);
      iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2d])
                        (this,local_40,(ulong)uVar3,value,flags);
      return iVar4;
    }
    BVar5 = AddProperty(this,local_40,local_58,value,'\a',(PropertyValueInfo *)propertyRecord,flags,
                        (flags & (PropertyOperation_ThrowIfNotExtensible|
                                 PropertyOperation_StrictMode)) != PropertyOperation_None,
                        SideEffects_Any);
    return BVar5;
  }
  bVar2 = DictionaryPropertyDescriptor<int>::SanityCheckFixedBits(local_38);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_48 = value;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x352,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar2) {
LAB_00c322e9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    value = local_48;
  }
  if ((local_38->Attributes & 8) == 0) {
    instance_00 = local_40;
    if ((!isInit) || ((local_38->flags & IsAccessor) == None)) goto LAB_00c322b5;
  }
  else {
    if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar2 = DynamicTypeHandler::VerifyIsExtensible
                          (&this->super_DynamicTypeHandler,scriptContext,
                           (flags & (PropertyOperation_ThrowIfNotExtensible|
                                    PropertyOperation_StrictMode)) != PropertyOperation_None),
       !bVar2)) {
      return 0;
    }
    ScriptContext::InvalidateProtoCaches(scriptContext,propertyId);
    instance_00 = local_40;
    bVar7 = 7;
    if ((local_38->Attributes & 0x10) != 0) {
      bVar7 = local_38->Attributes & 0xd0 | 7;
    }
    local_38->Attributes = bVar7;
    DynamicObject::SetHasNoEnumerableProperties(local_40,false);
  }
  DictionaryPropertyDescriptor<int>::ConvertToData(local_38);
LAB_00c322b5:
  SetPropertyWithDescriptor<true>
            (this,instance_00,local_58,&local_38,value,flags,(PropertyValueInfo *)propertyRecord);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, bool isInit)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
        bool isForce = (flags & PropertyOperation_Force) != 0;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return false;
                    }
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
                instance->SetHasNoEnumerableProperties(false);
                descriptor->ConvertToData();
            }
            else if (!allowLetConstGlobal && descriptor->HasNonLetConstGlobal() && !(descriptor->Attributes & PropertyWritable))
            {
                if (!isForce)
                {
                    JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
                }

                // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
                // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads.  This
                // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
                // the local cache (that would be illegal), but still populate the type's property cache.
                PropertyValueInfo::SetNoCache(info, instance);
                return false;
            }
            else if (isInit && descriptor->GetIsAccessor())
            {
                descriptor->ConvertToData();
            }
            SetPropertyWithDescriptor<allowLetConstGlobal>(instance, propertyRecord, &descriptor, value, flags, info);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }
        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, throwIfNotExtensible, SideEffects_Any);
        }